

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O0

int FinalizeSkipProba(VP8Encoder *enc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long in_RDI;
  int size;
  int nb_events;
  int nb_mbs;
  VP8EncProba *proba;
  undefined4 local_1c;
  
  iVar2 = *(int *)(in_RDI + 0x30) * *(int *)(in_RDI + 0x34);
  iVar1 = *(int *)(in_RDI + 0x5bd0);
  iVar3 = CalcSkipProba((long)iVar1,(long)iVar2);
  *(char *)(in_RDI + 0xe23) = (char)iVar3;
  *(uint *)(in_RDI + 0x5bcc) = (uint)(*(byte *)(in_RDI + 0xe23) < 0xfa);
  local_1c = 0x100;
  if (*(int *)(in_RDI + 0x5bcc) != 0) {
    iVar3 = VP8BitCost(1,*(uint8_t *)(in_RDI + 0xe23));
    iVar4 = VP8BitCost(0,*(uint8_t *)(in_RDI + 0xe23));
    local_1c = iVar1 * iVar3 + (iVar2 - iVar1) * iVar4 + 0x900;
  }
  return local_1c;
}

Assistant:

static int FinalizeSkipProba(VP8Encoder* const enc) {
  VP8EncProba* const proba = &enc->proba;
  const int nb_mbs = enc->mb_w * enc->mb_h;
  const int nb_events = proba->nb_skip;
  int size;
  proba->skip_proba = CalcSkipProba(nb_events, nb_mbs);
  proba->use_skip_proba = (proba->skip_proba < SKIP_PROBA_THRESHOLD);
  size = 256;   // 'use_skip_proba' bit
  if (proba->use_skip_proba) {
    size +=  nb_events * VP8BitCost(1, proba->skip_proba)
         + (nb_mbs - nb_events) * VP8BitCost(0, proba->skip_proba);
    size += 8 * 256;   // cost of signaling the 'skip_proba' itself.
  }
  return size;
}